

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsHEx<ImPlot::GetterXsYs<unsigned_short>,double>
               (char *label_id,GetterXsYs<unsigned_short> *getter,double height)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  ImPlotPlot *pIVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  ImPlotContext *pIVar16;
  bool bVar17;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  ImPlotRange *pIVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ImPlotRange IVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  ImVec2 b;
  ImVec2 a;
  byte local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar17 = BeginItem(label_id,1);
  pIVar16 = GImPlot;
  if (bVar17) {
    dVar31 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar18 = getter->Count, 0 < iVar18)) {
      puVar7 = getter->Xs;
      puVar8 = getter->Ys;
      iVar21 = getter->Offset;
      iVar3 = getter->Stride;
      pIVar9 = GImPlot->CurrentPlot;
      iVar4 = pIVar9->CurrentYAxis;
      uVar5 = (pIVar9->XAxis).Flags;
      pIVar22 = GImPlot->ExtentsY + iVar4;
      uVar6 = pIVar9->YAxis[iVar4].Flags;
      iVar20 = 0;
      do {
        lVar19 = (long)(((iVar21 + iVar20) % iVar18 + iVar18) % iVar18) * (long)iVar3;
        uVar2 = *(ushort *)((long)puVar7 + lVar19);
        dVar11 = (double)*(ushort *)((long)puVar8 + lVar19);
        dVar13 = dVar11 - dVar31;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((uVar5 & 0x20) == 0) {
LAB_001f9435:
            dVar14 = (pIVar16->ExtentsX).Min;
            dVar15 = (pIVar16->ExtentsX).Max;
            IVar28.Min = (double)(-(ulong)(dVar14 <= 0.0) & (ulong)dVar14);
            IVar28.Max = (double)(-(ulong)(0.0 <= dVar15) & (ulong)dVar15);
            pIVar16->ExtentsX = IVar28;
          }
        }
        else if ((((uVar5 & 0x20) == 0) && (pIVar9->YAxis[iVar4].Range.Min <= dVar13)) &&
                (dVar13 <= pIVar9->YAxis[iVar4].Range.Max)) goto LAB_001f9435;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar13) < 0x7ff0000000000000) {
LAB_001f9495:
            if ((0.0 < dVar13) || ((uVar6 & 0x20) == 0)) {
              dVar14 = pIVar16->ExtentsY[iVar4].Max;
              uVar24 = -(ulong)(dVar13 < pIVar22->Min);
              uVar25 = -(ulong)(dVar14 < dVar13);
              uVar23 = (ulong)dVar13 & uVar25;
              auVar29._0_8_ = ~uVar24 & (ulong)pIVar22->Min;
              auVar29._8_8_ = ~uVar25 & (ulong)dVar14;
              auVar12._8_4_ = (int)uVar23;
              auVar12._0_8_ = (ulong)dVar13 & uVar24;
              auVar12._12_4_ = (int)(uVar23 >> 0x20);
              *pIVar22 = (ImPlotRange)(auVar29 | auVar12);
            }
          }
        }
        else if ((((long)ABS(dVar13) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= 0.0)) &&
                (0.0 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f9495;
        dVar13 = (double)uVar2;
        dVar11 = dVar11 + dVar31;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((uVar2 != 0) || ((uVar5 & 0x20) == 0)) {
LAB_001f9510:
            dVar14 = (pIVar16->ExtentsX).Min;
            dVar15 = (pIVar16->ExtentsX).Max;
            uVar23 = -(ulong)(dVar13 < dVar14);
            uVar24 = -(ulong)(dVar15 < dVar13);
            auVar26._0_8_ = (ulong)dVar13 & uVar23;
            auVar26._8_8_ = (ulong)dVar13 & uVar24;
            auVar30._0_8_ = ~uVar23 & (ulong)dVar14;
            auVar30._8_8_ = ~uVar24 & (ulong)dVar15;
            pIVar16->ExtentsX = (ImPlotRange)(auVar30 | auVar26);
          }
        }
        else if (((pIVar9->YAxis[iVar4].Range.Min <= dVar11) &&
                 (dVar11 <= pIVar9->YAxis[iVar4].Range.Max)) &&
                (local_44 = (byte)((uVar5 & 0x20) >> 5), (uVar2 == 0 & local_44) == 0))
        goto LAB_001f9510;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar11) < 0x7ff0000000000000) {
LAB_001f9583:
            if ((0.0 < dVar11) || ((uVar6 & 0x20) == 0)) {
              dVar13 = pIVar16->ExtentsY[iVar4].Max;
              uVar24 = -(ulong)(dVar11 < pIVar22->Min);
              uVar25 = -(ulong)(dVar13 < dVar11);
              uVar23 = (ulong)dVar11 & uVar25;
              auVar27._0_8_ = ~uVar24 & (ulong)pIVar22->Min;
              auVar27._8_8_ = ~uVar25 & (ulong)dVar13;
              auVar10._8_4_ = (int)uVar23;
              auVar10._0_8_ = (ulong)dVar11 & uVar24;
              auVar10._12_4_ = (int)(uVar23 >> 0x20);
              *pIVar22 = (ImPlotRange)(auVar27 | auVar10);
            }
          }
        }
        else if ((((long)ABS(dVar11) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= dVar13))
                && (dVar13 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f9583;
        iVar20 = iVar20 + 1;
      } while (iVar18 != iVar20);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar16->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar16->NextItemData).Colors + 1);
    iVar18 = getter->Count;
    if (0 < iVar18) {
      bVar17 = (pIVar16->NextItemData).RenderFill;
      bVar1 = (pIVar16->NextItemData).RenderLine;
      iVar21 = 0;
      do {
        lVar19 = (long)(((getter->Offset + iVar21) % iVar18 + iVar18) % iVar18) *
                 (long)getter->Stride;
        uVar2 = *(ushort *)((long)getter->Xs + lVar19);
        if (uVar2 != 0) {
          dVar11 = (double)*(ushort *)((long)getter->Ys + lVar19);
          local_38 = PlotToPixels(0.0,dVar11 - dVar31,-1);
          local_40 = PlotToPixels((double)uVar2,dVar11 + dVar31,-1);
          if ((pIVar16->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar17 ^ 1U | col != col_00) & bVar1) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar16->NextItemData).LineWeight);
          }
          iVar18 = getter->Count;
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 < iVar18);
    }
    pIVar16 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar16->NextItemData);
    pIVar16->PreviousItem = pIVar16->CurrentItem;
    pIVar16->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}